

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainstate.cpp
# Opt level: O0

ChainstateLoadResult *
node::LoadChainstate
          (ChainstateManager *chainman,CacheSizes *cache_sizes,ChainstateLoadOptions *options)

{
  __tuple_element_t<0UL,_tuple<ChainstateLoadStatus,_bilingual_str>_> _Var1;
  ConstevalStringLiteral str;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  bool bVar2;
  undefined1 uVar3;
  SnapshotCompletionResult SVar4;
  uint64_t uVar5;
  __tuple_element_t<0UL,_tuple<ChainstateLoadStatus,_bilingual_str>_> *p_Var6;
  ConstevalFormatString<0U> fmt;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  ChainstateManager *in_RDI;
  long in_FS_OFFSET;
  type *init_error_1;
  type *init_status_1;
  SnapshotCompletionResult snapshot_completion;
  type *init_error;
  type *init_status;
  bool has_snapshot;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffb2c;
  char *b;
  base_blob<256U> *in_stack_fffffffffffffb38;
  ChainstateManager *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb40;
  ChainstateManager *in_stack_fffffffffffffb48;
  char *in_stack_fffffffffffffb50;
  undefined6 in_stack_fffffffffffffb58;
  undefined1 in_stack_fffffffffffffb5e;
  undefined1 in_stack_fffffffffffffb5f;
  string *in_stack_fffffffffffffb60;
  string *original;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffb6c;
  char *in_stack_fffffffffffffb70;
  allocator<char> *__s;
  undefined6 in_stack_fffffffffffffb78;
  undefined1 in_stack_fffffffffffffb7e;
  ChainstateManager *in_stack_fffffffffffffb80;
  LogFlags in_stack_fffffffffffffb90;
  ChainstateManager *flag;
  undefined8 in_stack_fffffffffffffb98;
  int source_line;
  ChainstateManager *this_00;
  ChainstateManager *in_stack_fffffffffffffbc0;
  ConstevalFormatString<0U> in_stack_fffffffffffffbd8;
  undefined8 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbec;
  uint uVar9;
  char *in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbff;
  undefined1 uVar10;
  ChainstateLoadOptions *in_stack_fffffffffffffc70;
  CacheSizes *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  allocator<char> local_355;
  undefined4 local_354;
  Level in_stack_fffffffffffffcd0;
  Chainstate *in_stack_fffffffffffffce0;
  _Base_ptr local_8;
  
  source_line = (int)((ulong)in_stack_fffffffffffffb98 >> 0x20);
  local_8 = *(_Base_ptr *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  ChainstateManager::AssumedValidBlock
            ((ChainstateManager *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
  bVar2 = base_blob<256U>::IsNull(in_stack_fffffffffffffb38);
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb48,
               (char *)in_stack_fffffffffffffb40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb48,
               (char *)in_stack_fffffffffffffb40);
    uVar7 = 2;
    logging_function_00._M_str._0_7_ = in_stack_fffffffffffffbf8;
    logging_function_00._M_len = (size_t)in_stack_fffffffffffffbf0;
    logging_function_00._M_str._7_1_ = in_stack_fffffffffffffbff;
    source_file_00._M_str._0_4_ = in_stack_fffffffffffffbe8;
    source_file_00._M_len = in_stack_fffffffffffffbe0;
    source_file_00._M_str._4_4_ = in_stack_fffffffffffffbec;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,source_line,in_stack_fffffffffffffb90,
               in_stack_fffffffffffffcd0,in_stack_fffffffffffffbd8);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb48,
               (char *)in_stack_fffffffffffffb40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb48,
               (char *)in_stack_fffffffffffffb40);
    ChainstateManager::AssumedValidBlock
              ((ChainstateManager *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    source_line = (int)((ulong)&stack0xffffffffffffffd8 >> 0x20);
    base_blob<256u>::GetHex_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffb40);
    uVar7 = 2;
    logging_function._M_str._0_7_ = in_stack_fffffffffffffbf8;
    logging_function._M_len = (size_t)in_stack_fffffffffffffbf0;
    logging_function._M_str._7_1_ = in_stack_fffffffffffffbff;
    source_file._M_str._0_4_ = in_stack_fffffffffffffbe8;
    source_file._M_len = in_stack_fffffffffffffbe0;
    source_file._M_str._4_4_ = in_stack_fffffffffffffbec;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,source_file,source_line,in_stack_fffffffffffffb90,
               in_stack_fffffffffffffcd0,(ConstevalFormatString<1U>)in_stack_fffffffffffffbd8.fmt,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffce0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb2c,uVar7));
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb48,
             (char *)in_stack_fffffffffffffb40);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb48,
             (char *)in_stack_fffffffffffffb40);
  ChainstateManager::MinimumChainWork
            ((ChainstateManager *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
  this = (ChainstateManager *)&stack0xffffffffffffffb8;
  base_uint<256u>::GetHex_abi_cxx11_((base_uint<256U> *)in_stack_fffffffffffffb40);
  b = "Setting nMinimumChainWork=%s\n";
  uVar7 = 2;
  logging_function_01._M_str._0_7_ = in_stack_fffffffffffffbf8;
  logging_function_01._M_len = (size_t)in_stack_fffffffffffffbf0;
  logging_function_01._M_str._7_1_ = in_stack_fffffffffffffbff;
  source_file_01._M_str._0_4_ = in_stack_fffffffffffffbe8;
  source_file_01._M_len = in_stack_fffffffffffffbe0;
  source_file_01._M_str._4_4_ = in_stack_fffffffffffffbec;
  flag = this;
  LogPrintFormatInternal<std::__cxx11::string>
            (logging_function_01,source_file_01,source_line,(LogFlags)this,in_stack_fffffffffffffcd0
             ,(ConstevalFormatString<1U>)in_stack_fffffffffffffbd8.fmt,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffce0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb2c,uVar7));
  ChainstateManager::MinimumChainWork
            ((ChainstateManager *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
  ChainstateManager::GetConsensus((ChainstateManager *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
  UintToArith256((uint256 *)in_stack_fffffffffffffb40);
  bVar2 = ::operator<((base_uint<256U> *)this,(base_uint<256U> *)b);
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb48,
               (char *)in_stack_fffffffffffffb40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb48,
               (char *)in_stack_fffffffffffffb40);
    ChainstateManager::GetConsensus((ChainstateManager *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
    this = (ChainstateManager *)&stack0xffffffffffffff78;
    base_blob<256u>::GetHex_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffb40);
    b = "Warning: nMinimumChainWork set below default value of %s\n";
    uVar7 = 2;
    logging_function_02._M_str._0_7_ = in_stack_fffffffffffffbf8;
    logging_function_02._M_len = (size_t)in_stack_fffffffffffffbf0;
    logging_function_02._M_str._7_1_ = in_stack_fffffffffffffbff;
    source_file_02._M_str._0_4_ = in_stack_fffffffffffffbe8;
    source_file_02._M_len = in_stack_fffffffffffffbe0;
    source_file_02._M_str._4_4_ = in_stack_fffffffffffffbec;
    in_stack_fffffffffffffb80 = this;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_02,source_file_02,source_line,(LogFlags)flag,
               in_stack_fffffffffffffcd0,(ConstevalFormatString<1U>)in_stack_fffffffffffffbd8.fmt,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffce0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb2c,uVar7));
  }
  uVar5 = BlockManager::GetPruneTarget((BlockManager *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
  if (uVar5 == 0xffffffffffffffff) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb48,
               (char *)in_stack_fffffffffffffb40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb48,
               (char *)in_stack_fffffffffffffb40);
    uVar7 = 2;
    b = 
    "Block pruning enabled.  Use RPC call pruneblockchain(height) to manually prune block and undo files.\n"
    ;
    logging_function_03._M_str._0_7_ = in_stack_fffffffffffffbf8;
    logging_function_03._M_len = (size_t)in_stack_fffffffffffffbf0;
    logging_function_03._M_str._7_1_ = in_stack_fffffffffffffbff;
    source_file_03._M_str._0_4_ = in_stack_fffffffffffffbe8;
    source_file_03._M_len = in_stack_fffffffffffffbe0;
    source_file_03._M_str._4_4_ = in_stack_fffffffffffffbec;
    LogPrintFormatInternal<>
              (logging_function_03,source_file_03,source_line,(LogFlags)flag,
               in_stack_fffffffffffffcd0,in_stack_fffffffffffffbd8);
  }
  else {
    uVar5 = BlockManager::GetPruneTarget((BlockManager *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
    if (uVar5 != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb48,
                 (char *)in_stack_fffffffffffffb40);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb48,
                 (char *)in_stack_fffffffffffffb40);
      uVar5 = BlockManager::GetPruneTarget
                        ((BlockManager *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
      this = (ChainstateManager *)&stack0xfffffffffffffcd0;
      uVar7 = 2;
      b = "Prune configured to target %u MiB on disk for block and undo files.\n";
      logging_function_04._M_str._0_7_ = in_stack_fffffffffffffbf8;
      logging_function_04._M_len = (size_t)in_stack_fffffffffffffbf0;
      logging_function_04._M_str._7_1_ = in_stack_fffffffffffffbff;
      source_file_04._M_str._0_4_ = in_stack_fffffffffffffbe8;
      source_file_04._M_len = in_stack_fffffffffffffbe0;
      source_file_04._M_str._4_4_ = in_stack_fffffffffffffbec;
      in_stack_fffffffffffffcd0 = (Level)(uVar5 >> 0x14);
      LogPrintFormatInternal<unsigned_long>
                (logging_function_04,source_file_04,source_line,(LogFlags)flag,
                 in_stack_fffffffffffffcd0,(ConstevalFormatString<1U>)in_stack_fffffffffffffbd8.fmt,
                 (unsigned_long *)in_stack_fffffffffffffce0);
    }
  }
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffb60,
             (char *)CONCAT17(in_stack_fffffffffffffb5f,
                              CONCAT16(in_stack_fffffffffffffb5e,in_stack_fffffffffffffb58)),
             in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffb48 >> 0x18,0));
  *(undefined8 *)(in_RSI + 0xcf0) = *(undefined8 *)(in_RDX + 0x10);
  *(undefined8 *)(in_RSI + 0xcf8) = *(undefined8 *)(in_RDX + 8);
  ChainstateManager::InitializeChainstate(this,(CTxMemPool *)in_stack_fffffffffffffb48);
  uVar3 = ChainstateManager::DetectSnapshotChainstate(in_stack_fffffffffffffb80);
  uVar10 = uVar3;
  if (((bool)uVar3) && ((*(byte *)(in_RCX + 0xb) & 1) != 0)) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb48,
               (char *)in_stack_fffffffffffffb40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb48,
               (char *)in_stack_fffffffffffffb40);
    in_stack_fffffffffffffbf0 = "[snapshot] deleting snapshot chainstate due to reindexing\n";
    b = "[snapshot] deleting snapshot chainstate due to reindexing\n";
    uVar7 = 2;
    logging_function_05._M_str._0_7_ = in_stack_fffffffffffffbf8;
    logging_function_05._M_len =
         (size_t)"[snapshot] deleting snapshot chainstate due to reindexing\n";
    logging_function_05._M_str._7_1_ = uVar10;
    source_file_05._M_str._0_4_ = in_stack_fffffffffffffbe8;
    source_file_05._M_len = in_stack_fffffffffffffbe0;
    source_file_05._M_str._4_4_ = in_stack_fffffffffffffbec;
    LogPrintFormatInternal<>
              (logging_function_05,source_file_05,source_line,(LogFlags)flag,
               in_stack_fffffffffffffcd0,in_stack_fffffffffffffbd8);
    in_stack_fffffffffffffb7e = ChainstateManager::DeleteSnapshotChainstate(this_00);
    if (!(bool)in_stack_fffffffffffffb7e) {
      local_354 = 2;
      __s = &local_355;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78)),
                 (char *)__s,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      Untranslated(in_stack_fffffffffffffb60);
      std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
      tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)this,(ChainstateLoadStatus *)b,
                 (bilingual_str *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
      bilingual_str::~bilingual_str((bilingual_str *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb2c,uVar7));
      std::allocator<char>::~allocator(&local_355);
      goto LAB_01128d1b;
    }
  }
  CompleteChainstateInitialization
            ((ChainstateManager *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
             in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  p_Var6 = std::get<0ul,node::ChainstateLoadStatus,bilingual_str>
                     ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)
                      CONCAT44(in_stack_fffffffffffffb2c,uVar7));
  fmt.fmt = (char *)std::get<1ul,node::ChainstateLoadStatus,bilingual_str>
                              ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)
                               CONCAT44(in_stack_fffffffffffffb2c,uVar7));
  if (*p_Var6 == SUCCESS) {
    SVar4 = ChainstateManager::MaybeCompleteSnapshotValidation
                      ((ChainstateManager *)CONCAT17(uVar10,in_stack_fffffffffffffbf8));
    if (SVar4 == SKIPPED) {
LAB_01128c79:
      std::__cxx11::string::string(in_stack_fffffffffffffb40);
      std::__cxx11::string::string(in_stack_fffffffffffffb40);
      std::tuple<node::ChainstateLoadStatus,_bilingual_str>::tuple<true,_true>
                ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)this,(ChainstateLoadStatus *)b,
                 (bilingual_str *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
      bilingual_str::~bilingual_str((bilingual_str *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
    }
    else if (SVar4 == SUCCESS) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb48,
                 (char *)in_stack_fffffffffffffb40);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb48,
                 (char *)in_stack_fffffffffffffb40);
      b = "[snapshot] cleaning up unneeded background chainstate, then reinitializing\n";
      uVar7 = 2;
      logging_function_06._M_str._0_7_ = in_stack_fffffffffffffbf8;
      logging_function_06._M_len = (size_t)in_stack_fffffffffffffbf0;
      logging_function_06._M_str._7_1_ = uVar10;
      source_file_06._M_str._0_4_ = in_stack_fffffffffffffbe8;
      source_file_06._M_len = (size_t)p_Var6;
      source_file_06._M_str._4_4_ = in_stack_fffffffffffffbec;
      LogPrintFormatInternal<>
                (logging_function_06,source_file_06,source_line,(LogFlags)flag,
                 in_stack_fffffffffffffcd0,fmt);
      bVar2 = ChainstateManager::ValidatedSnapshotCleanup(in_stack_fffffffffffffbc0);
      uVar8 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffb68);
      if (bVar2) {
        ChainstateManager::GetAll
                  ((ChainstateManager *)
                   CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78)));
        bVar2 = std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::empty
                          ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)this);
        if (!bVar2) {
          __assert_fail("chainman.GetAll().empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
                        ,0xe0,
                        "ChainstateLoadResult node::LoadChainstate(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                       );
        }
        std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
                  ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)this);
        bVar2 = ChainstateManager::IsSnapshotActive(in_stack_fffffffffffffb48);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          __assert_fail("!chainman.IsSnapshotActive()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
                        ,0xe1,
                        "ChainstateLoadResult node::LoadChainstate(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                       );
        }
        bVar2 = ChainstateManager::IsSnapshotValidated(this);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          __assert_fail("!chainman.IsSnapshotValidated()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
                        ,0xe2,
                        "ChainstateLoadResult node::LoadChainstate(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                       );
        }
        ChainstateManager::InitializeChainstate(this,(CTxMemPool *)in_stack_fffffffffffffb48);
        ChainstateManager::ActiveChainstate(this);
        Chainstate::ClearBlockIndexCandidates
                  ((Chainstate *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
        CompleteChainstateInitialization
                  ((ChainstateManager *)
                   CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                   in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
        p_Var6 = std::get<0ul,node::ChainstateLoadStatus,bilingual_str>
                           ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)
                            CONCAT44(in_stack_fffffffffffffb2c,uVar7));
        std::get<1ul,node::ChainstateLoadStatus,bilingual_str>
                  ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)
                   CONCAT44(in_stack_fffffffffffffb2c,uVar7));
        _Var1 = *p_Var6;
        if (_Var1 != SUCCESS) {
          std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
          tuple<node::ChainstateLoadStatus_&,_bilingual_str_&,_true>
                    ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)this,
                     (ChainstateLoadStatus *)b,
                     (bilingual_str *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
        }
        uVar9 = (uint)(_Var1 != SUCCESS);
        std::tuple<node::ChainstateLoadStatus,_bilingual_str>::~tuple
                  ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)
                   CONCAT44(in_stack_fffffffffffffb2c,uVar7));
        if (uVar9 == 0) goto LAB_01128c79;
      }
      else {
        original = (string *)&stack0xfffffffffffffc83;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78)),
                   in_stack_fffffffffffffb70,(allocator<char> *)CONCAT44(SVar4,uVar8));
        Untranslated(original);
        std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
        tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                  ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)this,
                   (ChainstateLoadStatus *)b,
                   (bilingual_str *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
        bilingual_str::~bilingual_str((bilingual_str *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb2c,uVar7));
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc83);
      }
    }
    else {
      str.lit._6_1_ = in_stack_fffffffffffffb7e;
      str.lit._0_6_ = in_stack_fffffffffffffb78;
      str.lit._7_1_ = uVar3;
      ::_(str);
      std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
      tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)this,(ChainstateLoadStatus *)b,
                 (bilingual_str *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
      bilingual_str::~bilingual_str((bilingual_str *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
    }
  }
  else {
    std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
    tuple<node::ChainstateLoadStatus_&,_bilingual_str_&,_true>
              ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)this,(ChainstateLoadStatus *)b,
               (bilingual_str *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
  }
  std::tuple<node::ChainstateLoadStatus,_bilingual_str>::~tuple
            ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)
             CONCAT44(in_stack_fffffffffffffb2c,uVar7));
LAB_01128d1b:
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffb2c,uVar7));
  if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (ChainstateLoadResult *)in_RDI;
}

Assistant:

ChainstateLoadResult LoadChainstate(ChainstateManager& chainman, const CacheSizes& cache_sizes,
                                    const ChainstateLoadOptions& options)
{
    if (!chainman.AssumedValidBlock().IsNull()) {
        LogPrintf("Assuming ancestors of block %s have valid signatures.\n", chainman.AssumedValidBlock().GetHex());
    } else {
        LogPrintf("Validating signatures for all blocks.\n");
    }
    LogPrintf("Setting nMinimumChainWork=%s\n", chainman.MinimumChainWork().GetHex());
    if (chainman.MinimumChainWork() < UintToArith256(chainman.GetConsensus().nMinimumChainWork)) {
        LogPrintf("Warning: nMinimumChainWork set below default value of %s\n", chainman.GetConsensus().nMinimumChainWork.GetHex());
    }
    if (chainman.m_blockman.GetPruneTarget() == BlockManager::PRUNE_TARGET_MANUAL) {
        LogPrintf("Block pruning enabled.  Use RPC call pruneblockchain(height) to manually prune block and undo files.\n");
    } else if (chainman.m_blockman.GetPruneTarget()) {
        LogPrintf("Prune configured to target %u MiB on disk for block and undo files.\n", chainman.m_blockman.GetPruneTarget() / 1024 / 1024);
    }

    LOCK(cs_main);

    chainman.m_total_coinstip_cache = cache_sizes.coins;
    chainman.m_total_coinsdb_cache = cache_sizes.coins_db;

    // Load the fully validated chainstate.
    chainman.InitializeChainstate(options.mempool);

    // Load a chain created from a UTXO snapshot, if any exist.
    bool has_snapshot = chainman.DetectSnapshotChainstate();

    if (has_snapshot && options.wipe_chainstate_db) {
        LogPrintf("[snapshot] deleting snapshot chainstate due to reindexing\n");
        if (!chainman.DeleteSnapshotChainstate()) {
            return {ChainstateLoadStatus::FAILURE_FATAL, Untranslated("Couldn't remove snapshot chainstate.")};
        }
    }

    auto [init_status, init_error] = CompleteChainstateInitialization(chainman, cache_sizes, options);
    if (init_status != ChainstateLoadStatus::SUCCESS) {
        return {init_status, init_error};
    }

    // If a snapshot chainstate was fully validated by a background chainstate during
    // the last run, detect it here and clean up the now-unneeded background
    // chainstate.
    //
    // Why is this cleanup done here (on subsequent restart) and not just when the
    // snapshot is actually validated? Because this entails unusual
    // filesystem operations to move leveldb data directories around, and that seems
    // too risky to do in the middle of normal runtime.
    auto snapshot_completion = chainman.MaybeCompleteSnapshotValidation();

    if (snapshot_completion == SnapshotCompletionResult::SKIPPED) {
        // do nothing; expected case
    } else if (snapshot_completion == SnapshotCompletionResult::SUCCESS) {
        LogPrintf("[snapshot] cleaning up unneeded background chainstate, then reinitializing\n");
        if (!chainman.ValidatedSnapshotCleanup()) {
            return {ChainstateLoadStatus::FAILURE_FATAL, Untranslated("Background chainstate cleanup failed unexpectedly.")};
        }

        // Because ValidatedSnapshotCleanup() has torn down chainstates with
        // ChainstateManager::ResetChainstates(), reinitialize them here without
        // duplicating the blockindex work above.
        assert(chainman.GetAll().empty());
        assert(!chainman.IsSnapshotActive());
        assert(!chainman.IsSnapshotValidated());

        chainman.InitializeChainstate(options.mempool);

        // A reload of the block index is required to recompute setBlockIndexCandidates
        // for the fully validated chainstate.
        chainman.ActiveChainstate().ClearBlockIndexCandidates();

        auto [init_status, init_error] = CompleteChainstateInitialization(chainman, cache_sizes, options);
        if (init_status != ChainstateLoadStatus::SUCCESS) {
            return {init_status, init_error};
        }
    } else {
        return {ChainstateLoadStatus::FAILURE, _(
           "UTXO snapshot failed to validate. "
           "Restart to resume normal initial block download, or try loading a different snapshot.")};
    }

    return {ChainstateLoadStatus::SUCCESS, {}};
}